

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void duckdb_parquet::swap(FileCryptoMetaData *a,FileCryptoMetaData *b)

{
  _EncryptionAlgorithm__isset _Var1;
  _FileCryptoMetaData__isset _Var2;
  
  swap(&(a->encryption_algorithm).AES_GCM_V1,&(b->encryption_algorithm).AES_GCM_V1);
  swap(&(a->encryption_algorithm).AES_GCM_CTR_V1,&(b->encryption_algorithm).AES_GCM_CTR_V1);
  _Var1 = (a->encryption_algorithm).__isset;
  (a->encryption_algorithm).__isset = (b->encryption_algorithm).__isset;
  (b->encryption_algorithm).__isset = _Var1;
  std::__cxx11::string::swap((string *)&a->key_metadata);
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(FileCryptoMetaData &a, FileCryptoMetaData &b) {
  using ::std::swap;
  swap(a.encryption_algorithm, b.encryption_algorithm);
  swap(a.key_metadata, b.key_metadata);
  swap(a.__isset, b.__isset);
}